

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O2

void pztopology::TPZPrism::ComputeHDivDirections<double>
               (TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  int iv;
  long col;
  int i_2;
  int i;
  long lVar4;
  long lVar5;
  bool bVar6;
  double dVar7;
  TPZManVector<double,_3> NormalScales;
  TPZManVector<double,_3> v2;
  TPZManVector<double,_3> v1;
  TPZManVector<double,_3> v3;
  double local_1f8;
  TPZManVector<double,_3> v3vdiag;
  TPZManVector<double,_3> vdiag;
  TPZManVector<double,_3> v2v3;
  TPZManVector<double,_3> v3v1;
  TPZManVector<double,_3> v1v2;
  TPZManVector<double,_3> vec3;
  TPZManVector<double,_3> vec2;
  TPZManVector<double,_3> vec1;
  
  dVar7 = TPZAxesTools<double>::ComputeDetjac(gradx);
  TPZManVector<double,_3>::TPZManVector(&v1,3);
  TPZManVector<double,_3>::TPZManVector(&v2,3);
  TPZManVector<double,_3>::TPZManVector(&v3,3);
  TPZManVector<double,_3>::TPZManVector(&v1v2,3);
  TPZManVector<double,_3>::TPZManVector(&v3v1,3);
  TPZManVector<double,_3>::TPZManVector(&v2v3,3);
  TPZManVector<double,_3>::TPZManVector(&vec1,3);
  TPZManVector<double,_3>::TPZManVector(&vec2,3);
  TPZManVector<double,_3>::TPZManVector(&vec3,3);
  TPZManVector<double,_3>::TPZManVector(&vdiag,3);
  TPZManVector<double,_3>::TPZManVector(&v3vdiag,3);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    pdVar3 = TPZFMatrix<double>::operator()(gradx,lVar4,0);
    v1.super_TPZVec<double>.fStore[lVar4] = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(gradx,lVar4,1);
    v2.super_TPZVec<double>.fStore[lVar4] = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(gradx,lVar4,2);
    v3.super_TPZVec<double>.fStore[lVar4] = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(gradx,lVar4,0);
    dVar1 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(gradx,lVar4,1);
    vdiag.super_TPZVec<double>.fStore[lVar4] = dVar1 - *pdVar3;
  }
  TPZNumeric::ProdVetorial<double>
            (&v1.super_TPZVec<double>,&v2.super_TPZVec<double>,&v1v2.super_TPZVec<double>);
  TPZNumeric::ProdVetorial<double>
            (&v2.super_TPZVec<double>,&v3.super_TPZVec<double>,&v2v3.super_TPZVec<double>);
  TPZNumeric::ProdVetorial<double>
            (&v3.super_TPZVec<double>,&v1.super_TPZVec<double>,&v3v1.super_TPZVec<double>);
  TPZNumeric::ProdVetorial<double>
            (&v3.super_TPZVec<double>,&vdiag.super_TPZVec<double>,&v3vdiag.super_TPZVec<double>);
  TPZNumeric::Norm<double>(&v1v2.super_TPZVec<double>);
  TPZNumeric::Norm<double>(&v2v3.super_TPZVec<double>);
  TPZNumeric::Norm<double>(&v3v1.super_TPZVec<double>);
  TPZNumeric::Norm<double>(&v3vdiag.super_TPZVec<double>);
  local_1f8 = 1.0;
  TPZManVector<double,_3>::TPZManVector(&NormalScales,4,&local_1f8);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    v1.super_TPZVec<double>.fStore[lVar4] = v1.super_TPZVec<double>.fStore[lVar4] / dVar7;
    v2.super_TPZVec<double>.fStore[lVar4] = v2.super_TPZVec<double>.fStore[lVar4] / dVar7;
    v3.super_TPZVec<double>.fStore[lVar4] = v3.super_TPZVec<double>.fStore[lVar4] / dVar7;
  }
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    col = 0;
    lVar5 = 7;
    while( true ) {
      bVar6 = lVar5 == 0;
      lVar5 = lVar5 + -1;
      if (bVar6) break;
      dVar7 = v3.super_TPZVec<double>.fStore[lVar4];
      dVar1 = *NormalScales.super_TPZVec<double>.fStore;
      pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,col);
      *pdVar3 = dVar1 * dVar7 * -6.0;
      dVar7 = v3.super_TPZVec<double>.fStore[lVar4];
      dVar1 = *NormalScales.super_TPZVec<double>.fStore;
      pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,col + 0x22);
      *pdVar3 = dVar7 * dVar1 * 6.0;
      col = col + 1;
    }
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[2];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,7);
    *pdVar3 = dVar7 * -2.0 * dVar1;
    dVar7 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar1 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar2 = NormalScales.super_TPZVec<double>.fStore[2];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,8);
    *pdVar3 = ((dVar7 - dVar1) + (dVar7 - dVar1)) * dVar2;
    dVar7 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar1 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar2 = NormalScales.super_TPZVec<double>.fStore[2];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,9);
    *pdVar3 = ((dVar7 - dVar1) + (dVar7 - dVar1)) * dVar2;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[2];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,10);
    *pdVar3 = dVar7 * -2.0 * dVar1;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,7);
    dVar7 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,8);
    dVar1 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0xb);
    *pdVar3 = (dVar7 + dVar1) * 0.5;
    dVar7 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar1 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar2 = NormalScales.super_TPZVec<double>.fStore[2];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0xc);
    *pdVar3 = ((dVar7 - dVar1) + (dVar7 - dVar1)) * dVar2;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,9);
    dVar7 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,10);
    dVar1 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0xd);
    *pdVar3 = (dVar7 + dVar1) * 0.5;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[2];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0xe);
    *pdVar3 = dVar7 * -2.0 * dVar1;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0xc);
    dVar7 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0xe);
    dVar1 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0xf);
    *pdVar3 = (dVar7 + dVar1) * 0.5;
    dVar7 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[3];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x10);
    *pdVar3 = (dVar7 + dVar7) * dVar1;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[3];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x11);
    *pdVar3 = (dVar7 + dVar7) * dVar1;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[3];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x12);
    *pdVar3 = (dVar7 + dVar7) * dVar1;
    dVar7 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[3];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x13);
    *pdVar3 = (dVar7 + dVar7) * dVar1;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x10);
    dVar7 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x11);
    dVar1 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x14);
    *pdVar3 = (dVar7 + dVar1) * 0.5;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[3];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x15);
    *pdVar3 = (dVar7 + dVar7) * dVar1;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x12);
    dVar7 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x13);
    dVar1 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x16);
    *pdVar3 = (dVar7 + dVar1) * 0.5;
    dVar7 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[3];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x17);
    *pdVar3 = (dVar7 + dVar7) * dVar1;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x15);
    dVar7 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x17);
    dVar1 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x18);
    *pdVar3 = (dVar7 + dVar1) * 0.5;
    dVar7 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[1];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x19);
    *pdVar3 = dVar7 * -2.0 * dVar1;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar2 = NormalScales.super_TPZVec<double>.fStore[1];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x1a);
    *pdVar3 = ((dVar7 - dVar1) + (dVar7 - dVar1)) * dVar2;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar2 = NormalScales.super_TPZVec<double>.fStore[1];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x1b);
    *pdVar3 = ((dVar7 - dVar1) + (dVar7 - dVar1)) * dVar2;
    dVar7 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[1];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x1c);
    *pdVar3 = dVar7 * -2.0 * dVar1;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x19);
    dVar7 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x1a);
    dVar1 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x1d);
    *pdVar3 = (dVar7 + dVar1) * 0.5;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar2 = NormalScales.super_TPZVec<double>.fStore[1];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x1e);
    *pdVar3 = ((dVar7 - dVar1) + (dVar7 - dVar1)) * dVar2;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x1b);
    dVar7 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x1c);
    dVar1 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x1f);
    *pdVar3 = (dVar7 + dVar1) * 0.5;
    dVar7 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[1];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x20);
    *pdVar3 = dVar7 * -2.0 * dVar1;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x1e);
    dVar7 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x20);
    dVar1 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x21);
    *pdVar3 = (dVar7 + dVar1) * 0.5;
    dVar7 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[1];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x29);
    *pdVar3 = (dVar7 + dVar7) * dVar1;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = v1.super_TPZVec<double>.fStore[lVar4];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x2a);
    *pdVar3 = (dVar7 - dVar1) * 0.5;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[2];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x2b);
    *pdVar3 = dVar7 * -2.0 * dVar1;
    dVar7 = v3.super_TPZVec<double>.fStore[lVar4];
    dVar1 = *NormalScales.super_TPZVec<double>.fStore;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x2c);
    *pdVar3 = dVar7 * dVar1;
    dVar7 = v3.super_TPZVec<double>.fStore[lVar4];
    dVar1 = *NormalScales.super_TPZVec<double>.fStore;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x2d);
    *pdVar3 = dVar7 * dVar1;
    dVar7 = v3.super_TPZVec<double>.fStore[lVar4];
    dVar1 = *NormalScales.super_TPZVec<double>.fStore;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x2e);
    *pdVar3 = dVar7 * dVar1;
    dVar7 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[1];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x2f);
    *pdVar3 = (dVar7 + dVar7) * dVar1;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = v1.super_TPZVec<double>.fStore[lVar4];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x30);
    *pdVar3 = (dVar7 - dVar1) * 0.5;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[2];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x31);
    *pdVar3 = dVar7 * -2.0 * dVar1;
    dVar7 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[1];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x32);
    *pdVar3 = (dVar7 + dVar7) * dVar1;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[2];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x33);
    *pdVar3 = (dVar7 + dVar7) * dVar1;
    dVar7 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[1];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x34);
    *pdVar3 = (dVar7 + dVar7) * dVar1 * 0.5;
    dVar7 = v3.super_TPZVec<double>.fStore[lVar4];
    dVar1 = *NormalScales.super_TPZVec<double>.fStore;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x35);
    *pdVar3 = dVar7 * dVar1;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = v1.super_TPZVec<double>.fStore[lVar4];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x36);
    *pdVar3 = (dVar7 - dVar1) * 0.5;
    dVar7 = v3.super_TPZVec<double>.fStore[lVar4];
    dVar1 = *NormalScales.super_TPZVec<double>.fStore;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x37);
    *pdVar3 = dVar7 * dVar1;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[2];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x38);
    *pdVar3 = (dVar7 + dVar7) * dVar1 * 0.5;
    dVar7 = v3.super_TPZVec<double>.fStore[lVar4];
    dVar1 = *NormalScales.super_TPZVec<double>.fStore;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x39);
    *pdVar3 = dVar7 * dVar1;
    dVar7 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[1];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x3a);
    *pdVar3 = (dVar7 + dVar7) * dVar1;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[2];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x3b);
    *pdVar3 = (dVar7 + dVar7) * dVar1;
    dVar7 = v1.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[1];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x3c);
    *pdVar3 = (dVar7 + dVar7) * dVar1;
    dVar7 = v2.super_TPZVec<double>.fStore[lVar4];
    dVar1 = NormalScales.super_TPZVec<double>.fStore[2];
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x3d);
    *pdVar3 = (dVar7 + dVar7) * dVar1;
    dVar7 = v3.super_TPZVec<double>.fStore[lVar4];
    dVar1 = *NormalScales.super_TPZVec<double>.fStore;
    pdVar3 = TPZFMatrix<double>::operator()(directions,lVar4,0x3e);
    *pdVar3 = dVar7 * dVar1;
  }
  TPZManVector<double,_3>::~TPZManVector(&NormalScales);
  TPZManVector<double,_3>::~TPZManVector(&v3vdiag);
  TPZManVector<double,_3>::~TPZManVector(&vdiag);
  TPZManVector<double,_3>::~TPZManVector(&vec3);
  TPZManVector<double,_3>::~TPZManVector(&vec2);
  TPZManVector<double,_3>::~TPZManVector(&vec1);
  TPZManVector<double,_3>::~TPZManVector(&v2v3);
  TPZManVector<double,_3>::~TPZManVector(&v3v1);
  TPZManVector<double,_3>::~TPZManVector(&v1v2);
  TPZManVector<double,_3>::~TPZManVector(&v3);
  TPZManVector<double,_3>::~TPZManVector(&v2);
  TPZManVector<double,_3>::~TPZManVector(&v1);
  return;
}

Assistant:

void TPZPrism::ComputeHDivDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions)
    {
        TVar detjac = TPZAxesTools<TVar>::ComputeDetjac(gradx);
        
        TPZManVector<TVar,3> v1(3),v2(3),v3(3),v1v2(3),v3v1(3),v2v3(3),vec1(3),vec2(3),vec3(3), vdiag(3), v3vdiag(3);
        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
            v3[i] = gradx(i,2);
            vdiag[i] = (gradx(i,0)-gradx(i,1));
        }

        
        TPZNumeric::ProdVetorial(v1,v2,v1v2);
        TPZNumeric::ProdVetorial(v2,v3,v2v3);
        TPZNumeric::ProdVetorial(v3,v1,v3v1);
        TPZNumeric::ProdVetorial(v3,vdiag,v3vdiag);
        
        TVar Nv1v2 = TPZNumeric::Norm(v1v2);
        TVar Nv2v3 = TPZNumeric::Norm(v2v3);
        TVar Nv3v1 = TPZNumeric::Norm(v3v1);
        TVar Nv3vdiag = TPZNumeric::Norm(v3vdiag);
        
        /**
         * @file
         * @brief Computing mapped vector with scaling factor equal 1.0.
         * using contravariant piola mapping.
         */
        TPZManVector<TVar,3> NormalScales(4,1.);
        
        
        {
            Nv1v2 = 1.;
            Nv2v3 = 2.;
            Nv3v1 = 2.;
            Nv3vdiag = 2.;
        }
        
        
        for (int i=0; i<3; i++) {
            v1[i] /= detjac;
            v2[i] /= detjac;
            v3[i] /= detjac;
        }
        for (int i=0; i<3; i++)
        {
            for (int iv=0; iv<7; iv++)
            {
                directions(i,iv) = -v3[i]*NormalScales[0]*6.;
                directions(i,iv+34) = v3[i]*NormalScales[0]*6.;
            }
            //face 1
            directions(i,7) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,8) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,9) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,10) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,11) = ( directions(i,7)+directions(i,8) )/2.;
            directions(i,12) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,13) = ( directions(i,9)+directions(i,10) )/2.;
            directions(i,14) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,15) = ( directions(i,12)+directions(i,14) )/2.;
            //face 2
            directions(i,16) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,17) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,18) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,19) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,20) = (directions(i,16) + directions(i,17))/2.;
            directions(i,21) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,22) = (directions(i,18) + directions(i,19))/2.;
            directions(i,23) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,24) = (directions(i,21) + directions(i,23))/2.;
            //face 3
            directions(i,25) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,26) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,27) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,28) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,29) = ( directions(i,25)+directions(i,26) )/2.;
            directions(i,30) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,31) = ( directions(i,27)+directions(i,28) )/2.;
            directions(i,32) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,33) = ( directions(i,30)+directions(i,32) )/2.;
            
            //arestas
            directions(i,41) = v1[i]*Nv2v3*NormalScales[1];//
            directions(i,42) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,43) = -v2[i]*Nv3v1*NormalScales[2];//
            
            directions(i,44) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,45) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,46) = v3[i]*Nv1v2*NormalScales[0];
            
            directions(i,47) = v1[i]*Nv2v3*NormalScales[1];//
            directions(i,48) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,49) = -v2[i]*Nv3v1*NormalScales[2];//
            
            // internal in faces
            directions(i,50) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,51) = v2[i]*Nv3v1*NormalScales[2];
            directions(i,52) = v1[i]*Nv2v3*NormalScales[1]/2.;//
            directions(i,53) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,54) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,55) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,56) = v2[i]*Nv3v1*NormalScales[2]/2.;
            directions(i,57) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,58) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,59) = v2[i]*Nv3v1*NormalScales[2];
            
            
            directions(i,60) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,61) = v2[i]*Nv3v1*NormalScales[2];
            directions(i,62) = v3[i]*Nv1v2*NormalScales[0];
            
        }
        
    }